

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O3

int saisxx_private::
    suffixsort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               T,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,long fs,
              long n,long k,bool isbwt)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var18;
  uint *local_58;
  
  if (fs < k) {
    plVar5 = (long *)operator_new__(-(ulong)((ulong)k >> 0x3d != 0) | k * 8);
    if (0 < k) {
      memset(plVar5,0,k * 8);
    }
    if (0 < n) {
      lVar6 = 0;
      do {
        plVar5[T._M_current[lVar6]] = plVar5[T._M_current[lVar6]] + 1;
        lVar6 = lVar6 + 1;
      } while (n != lVar6);
    }
    if (0 < k) {
      lVar6 = 0;
      lVar11 = 0;
      do {
        lVar6 = lVar6 + plVar5[lVar11];
        plVar5[lVar11] = lVar6;
        lVar11 = lVar11 + 1;
      } while (k != lVar11);
    }
    if (0 < n) {
      iVar4 = 0;
      memset(SA._M_current,0,n * 8);
      if (n != 1) {
        lVar6 = n + -1;
        uVar10 = T._M_current[n + -1];
        do {
          uVar1 = T._M_current[lVar6 + -1];
          iVar3 = 1;
          if (iVar4 + uVar10 <= uVar1) {
            iVar3 = 0;
            if (iVar4 != 0) {
              lVar11 = plVar5[uVar10];
              plVar5[uVar10] = lVar11 + -1;
              SA._M_current[lVar11 + -1] = lVar6;
              iVar3 = 0;
            }
          }
          iVar4 = iVar3;
          lVar6 = lVar6 + -1;
          uVar10 = uVar1;
        } while (0 < lVar6);
      }
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
              (T,SA,plVar5,plVar5,n,k);
    operator_delete__(plVar5);
  }
  else {
    _Var18._M_current = SA._M_current + n;
    lVar6 = 0;
    if (k <= fs - k) {
      lVar6 = k;
    }
    if (0 < k) {
      memset(_Var18._M_current,0,k * 8);
    }
    if (0 < n) {
      lVar11 = 0;
      do {
        _Var18._M_current[T._M_current[lVar11]] = _Var18._M_current[T._M_current[lVar11]] + 1;
        lVar11 = lVar11 + 1;
      } while (n != lVar11);
    }
    _Var13._M_current = _Var18._M_current + lVar6;
    if (0 < k) {
      lVar6 = 0;
      lVar11 = 0;
      do {
        lVar6 = lVar6 + _Var18._M_current[lVar11];
        _Var13._M_current[lVar11] = lVar6;
        lVar11 = lVar11 + 1;
      } while (k != lVar11);
    }
    if (0 < n) {
      iVar4 = 0;
      memset(SA._M_current,0,n * 8);
      if (n != 1) {
        lVar6 = n + -1;
        uVar10 = T._M_current[n + -1];
        do {
          uVar1 = T._M_current[lVar6 + -1];
          iVar3 = 1;
          if (iVar4 + uVar10 <= uVar1) {
            iVar3 = 0;
            if (iVar4 != 0) {
              lVar11 = _Var13._M_current[uVar10];
              _Var13._M_current[uVar10] = lVar11 + -1;
              SA._M_current[lVar11 + -1] = lVar6;
              iVar3 = 0;
            }
          }
          iVar4 = iVar3;
          lVar6 = lVar6 + -1;
          uVar10 = uVar1;
        } while (0 < lVar6);
      }
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,SA,_Var18,_Var13,n,k);
  }
  if (n < 1) {
    lVar6 = 0;
  }
  else {
    lVar11 = 0;
    lVar6 = 0;
    do {
      lVar7 = SA._M_current[lVar11];
      if (0 < lVar7) {
        uVar10 = T._M_current[lVar7];
        lVar14 = lVar7 + 1;
        if (lVar14 < n && uVar10 < T._M_current[lVar7 + -1]) {
          do {
            if (uVar10 != T._M_current[lVar14]) {
              if (uVar10 < T._M_current[lVar14]) {
                SA._M_current[lVar6] = lVar7;
                lVar6 = lVar6 + 1;
              }
              break;
            }
            lVar14 = lVar14 + 1;
          } while (n != lVar14);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != n);
  }
  lVar7 = n >> 1;
  lVar11 = lVar7 + lVar6;
  if (lVar7 < 1) {
    local_58 = T._M_current + n + -1;
  }
  else {
    lVar14 = lVar6 + 1;
    if (lVar6 + 1 < lVar11) {
      lVar14 = lVar11;
    }
    iVar4 = 0;
    memset(SA._M_current + lVar6,0,(lVar14 - lVar6) * 8);
    local_58 = T._M_current + n + -1;
    uVar8 = n - 1;
    lVar14 = -n;
    uVar15 = n;
    uVar10 = *local_58;
    do {
      lVar14 = lVar14 + 1;
      uVar1 = T._M_current[uVar8 - 1];
      iVar3 = 1;
      if ((uVar10 + iVar4 <= uVar1) && (iVar3 = 0, iVar4 != 0)) {
        *(ulong *)((long)(SA._M_current + lVar6) + (uVar8 & 0xfffffffffffffffe) * 4) =
             uVar15 + lVar14;
        uVar15 = uVar8;
      }
      iVar4 = iVar3;
      uVar8 = uVar8 - 1;
      uVar10 = uVar1;
    } while (0 < (long)uVar8);
  }
  if (lVar6 < 1) {
    lVar14 = 0;
  }
  else {
    lVar12 = 0;
    lVar9 = 0;
    lVar14 = 0;
    lVar16 = n;
    do {
      lVar2 = SA._M_current[lVar12];
      if (SA._M_current[lVar6 + (lVar2 >> 1)] == lVar9) {
        if (lVar9 < 1) {
          lVar17 = 0;
LAB_00164364:
          if (lVar17 != lVar9) goto LAB_00164371;
        }
        else {
          lVar17 = 0;
          do {
            if (T._M_current[lVar2 + lVar17] != T._M_current[lVar16 + lVar17]) goto LAB_00164364;
            lVar17 = lVar17 + 1;
          } while (lVar9 != lVar17);
        }
      }
      else {
LAB_00164371:
        lVar14 = lVar14 + 1;
        lVar9 = SA._M_current[lVar6 + (lVar2 >> 1)];
        lVar16 = lVar2;
      }
      SA._M_current[lVar6 + (lVar2 >> 1)] = lVar14;
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar6);
  }
  if (lVar14 < lVar6) {
    _Var18._M_current = SA._M_current + n + (fs - lVar6);
    lVar16 = lVar6 + -1;
    lVar9 = lVar16;
    if (0 < lVar7) {
      do {
        if (SA._M_current[lVar11 + -1] != 0) {
          _Var18._M_current[lVar9] = SA._M_current[lVar11 + -1] + -1;
          lVar9 = lVar9 + -1;
        }
        lVar11 = lVar11 + -1;
      } while (lVar6 < lVar11);
    }
    iVar4 = suffixsort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                      (_Var18,SA,fs + n + lVar6 * -2,lVar6,lVar14,false);
    if (iVar4 != 0) {
      return -2;
    }
    if (0 < lVar7) {
      lVar11 = n + -1;
      iVar4 = 0;
      uVar10 = *local_58;
      do {
        uVar1 = T._M_current[lVar11 + -1];
        iVar3 = 1;
        if ((uVar10 + iVar4 <= uVar1) && (iVar3 = 0, iVar4 != 0)) {
          _Var18._M_current[lVar16] = lVar11;
          lVar16 = lVar16 + -1;
        }
        iVar4 = iVar3;
        lVar11 = lVar11 + -1;
        uVar10 = uVar1;
      } while (0 < lVar11);
    }
    if (0 < lVar6) {
      lVar11 = 0;
      do {
        SA._M_current[lVar11] = _Var18._M_current[SA._M_current[lVar11]];
        lVar11 = lVar11 + 1;
      } while (lVar6 != lVar11);
    }
  }
  if (fs < k) {
    plVar5 = (long *)operator_new__(-(ulong)((ulong)k >> 0x3d != 0) | k * 8);
    if (0 < k) {
      memset(plVar5,0,k * 8);
    }
    if (0 < n) {
      lVar11 = 0;
      do {
        plVar5[T._M_current[lVar11]] = plVar5[T._M_current[lVar11]] + 1;
        lVar11 = lVar11 + 1;
      } while (n != lVar11);
    }
    if (0 < k) {
      lVar11 = 0;
      lVar7 = 0;
      do {
        lVar11 = lVar11 + plVar5[lVar7];
        plVar5[lVar7] = lVar11;
        lVar7 = lVar7 + 1;
      } while (k != lVar7);
    }
    if (n - lVar6 != 0 && lVar6 <= n) {
      memset(SA._M_current + lVar6,0,(n - lVar6) * 8);
    }
    if (0 < lVar6) {
      uVar8 = lVar6 + 1;
      do {
        lVar6 = SA._M_current[uVar8 - 2];
        SA._M_current[uVar8 - 2] = 0;
        lVar11 = plVar5[T._M_current[lVar6]];
        plVar5[T._M_current[lVar6]] = lVar11 + -1;
        SA._M_current[lVar11 + -1] = lVar6;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    if (isbwt) {
      iVar4 = computeBWT<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
                        (T,SA,plVar5,plVar5,n,k);
    }
    else {
      induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
                (T,SA,plVar5,plVar5,n,k);
      iVar4 = 0;
    }
    operator_delete__(plVar5);
  }
  else {
    _Var18._M_current = SA._M_current + n;
    lVar11 = 0;
    if (k <= fs - k) {
      lVar11 = k;
    }
    if (0 < k) {
      memset(_Var18._M_current,0,k * 8);
    }
    if (0 < n) {
      lVar7 = 0;
      do {
        _Var18._M_current[T._M_current[lVar7]] = _Var18._M_current[T._M_current[lVar7]] + 1;
        lVar7 = lVar7 + 1;
      } while (n != lVar7);
    }
    _Var13._M_current = _Var18._M_current + lVar11;
    if (0 < k) {
      lVar11 = 0;
      lVar7 = 0;
      do {
        lVar11 = lVar11 + _Var18._M_current[lVar7];
        _Var13._M_current[lVar7] = lVar11;
        lVar7 = lVar7 + 1;
      } while (k != lVar7);
    }
    if (n - lVar6 != 0 && lVar6 <= n) {
      memset(SA._M_current + lVar6,0,(n - lVar6) * 8);
    }
    if (0 < lVar6) {
      uVar8 = lVar6 + 1;
      do {
        lVar6 = SA._M_current[uVar8 - 2];
        SA._M_current[uVar8 - 2] = 0;
        lVar11 = _Var13._M_current[T._M_current[lVar6]];
        _Var13._M_current[T._M_current[lVar6]] = lVar11 + -1;
        SA._M_current[lVar11 + -1] = lVar6;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
    }
    if (isbwt) {
      iVar4 = computeBWT<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                        (T,SA,_Var18,_Var13,n,k);
      return iVar4;
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (T,SA,_Var18,_Var13,n,k);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int
suffixsort(string_type T, sarray_type SA,
           index_type fs, index_type n, index_type k,
           bool isbwt) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type RA;
  index_type i, j, m, p, q, plen, qlen, name;
  int pidx = 0;
  bool diff;
  int c;
#ifdef _OPENMP
  int maxthreads = omp_get_max_threads();
#else
# define maxthreads 1
#endif
  char_type c0, c1;

  /* stage 1: reduce the problem by at least 1/2
     sort all the S-substrings */
  if(fs < (maxthreads * k)) {
    index_type *C, *B;
    C = new index_type[maxthreads * k];
    B = (1 < maxthreads) ? C + k : C;
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < n; ++i) { SA[i] = 0; }
    for(i = n - 2, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { SA[--B[c1]] = i + 1, c = 0; }
    }
    induceSA(T, SA, C, B, n, k);
    delete [] C;
  } else {
    sarray_type C, B;
    C = SA + n;
    B = ((1 < maxthreads) || (k <= (fs - k))) ? C + k : C;
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < n; ++i) { SA[i] = 0; }
    for(i = n - 2, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { SA[--B[c1]] = i + 1, c = 0; }
    }
    induceSA(T, SA, C, B, n, k);
  }

  /* compact all the sorted substrings into the first m items of SA
     2*m must be not larger than n (proveable) */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i, j, p, c0, c1)
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if((0 < p) && (T[p - 1] > (c0 = T[p]))) {
      for(j = p + 1; (j < n) && (c0 == (c1 = T[j])); ++j) { }
      if((j < n) && (c0 < c1)) { SA[i] = ~p; }
    }
  }
  for(i = 0, m = 0; i < n; ++i) { if((p = SA[i]) < 0) { SA[m++] = ~p; } }
#else
  for(i = 0, m = 0; i < n; ++i) {
    p = SA[i];
    if((0 < p) && (T[p - 1] > (c0 = T[p]))) {
      for(j = p + 1; (j < n) && (c0 == (c1 = T[j])); ++j) { }
      if((j < n) && (c0 < c1)) { SA[m++] = p; }
    }
  }
#endif
  j = m + (n >> 1);
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
  for(i = m; i < j; ++i) { SA[i] = 0; } /* init the name array buffer */
  /* store the length of all substrings */
  for(i = n - 2, j = n, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
    if((c0 = T[i]) < (c1 + c)) { c = 1; }
    else if(c != 0) { SA[m + ((i + 1) >> 1)] = j - i - 1; j = i + 1; c = 0; }
  }
  /* find the lexicographic names of all substrings */
  for(i = 0, name = 0, q = n, qlen = 0; i < m; ++i) {
    p = SA[i], plen = SA[m + (p >> 1)], diff = true;
    if(plen == qlen) {
      for(j = 0; (j < plen) && (T[p + j] == T[q + j]); ++j) { }
      if(j == plen) { diff = false; }
    }
    if(diff != false) { ++name, q = p, qlen = plen; }
    SA[m + (p >> 1)] = name;
  }

  /* stage 2: solve the reduced problem
     recurse if names are not yet unique */
  if(name < m) {
    RA = SA + n + fs - m;
    for(i = m + (n >> 1) - 1, j = m - 1; m <= i; --i) {
      if(SA[i] != 0) { RA[j--] = SA[i] - 1; }
    }
    if(suffixsort(RA, SA, fs + n - m * 2, m, name, false) != 0) { return -2; }
    for(i = n - 2, j = m - 1, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { RA[j--] = i + 1, c = 0; } /* get p1 */
    }
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < m; ++i) { SA[i] = RA[SA[i]]; } /* get index in s */
  }

  /* stage 3: induce the result for the original problem */
  if(fs < (maxthreads * k)) {
    index_type *B, *C;
    C = new index_type[maxthreads * k];
    B = (1 < maxthreads) ? C + k : C;
    /* put all left-most S characters into their buckets */
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = m; i < n; ++i) { SA[i] = 0; } /* init SA[m..n-1] */
    for(i = m - 1; 0 <= i; --i) {
      j = SA[i], SA[i] = 0;
      SA[--B[T[j]]] = j;
    }
    if(isbwt == false) { induceSA(T, SA, C, B, n, k); }
    else { pidx = computeBWT(T, SA, C, B, n, k); }
    delete [] C;
  } else {
    sarray_type C, B;
    C = SA + n;
    B = ((1 < maxthreads) || (k <= (fs - k))) ? C + k : C;
    /* put all left-most S characters into their buckets */
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = m; i < n; ++i) { SA[i] = 0; } /* init SA[m..n-1] */
    for(i = m - 1; 0 <= i; --i) {
      j = SA[i], SA[i] = 0;
      SA[--B[T[j]]] = j;
    }
    if(isbwt == false) { induceSA(T, SA, C, B, n, k); }
    else { pidx = computeBWT(T, SA, C, B, n, k); }
  }

  return pidx;
#ifndef _OPENMP
# undef maxthreads
#endif
}